

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaCommand.cxx
# Opt level: O0

TypeEnumType __thiscall MetaCommand::StringToType(MetaCommand *this,char *type)

{
  int iVar1;
  char *in_RSI;
  TypeEnumType local_4;
  
  iVar1 = strcmp(in_RSI,"int");
  if (iVar1 == 0) {
    local_4 = INT;
  }
  else {
    iVar1 = strcmp(in_RSI,"float");
    if (iVar1 == 0) {
      local_4 = FLOAT;
    }
    else {
      iVar1 = strcmp(in_RSI,"string");
      if (iVar1 == 0) {
        local_4 = STRING;
      }
      else {
        iVar1 = strcmp(in_RSI,"list");
        if (iVar1 == 0) {
          local_4 = LIST;
        }
        else {
          iVar1 = strcmp(in_RSI,"flag");
          if (iVar1 == 0) {
            local_4 = FLAG;
          }
          else {
            local_4 = INT;
          }
        }
      }
    }
  }
  return local_4;
}

Assistant:

MetaCommand::TypeEnumType MetaCommand::StringToType(const char* type)
{
  if(!strcmp(type,"int"))
    {
    return INT;
    }
  if(!strcmp(type,"float"))
    {
    return FLOAT;
    }
  if(!strcmp(type,"string"))
    {
    return STRING;
    }
  if(!strcmp(type,"list"))
    {
    return LIST;
    }
  if(!strcmp(type,"flag"))
    {
    return FLAG;
    }

  return INT; // by default

}